

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

RenderBox * __thiscall
Rml::Element::GetRenderBox
          (RenderBox *__return_storage_ptr__,Element *this,BoxArea fill_area,int index)

{
  code *pcVar1;
  Vector2f VVar2;
  EdgeSizes border_widths;
  bool bVar3;
  reference pvVar4;
  float fVar5;
  CornerSizes border_radius;
  Vector2f local_5c;
  Vector2f inner_size;
  int area;
  EdgeSizes edge_sizes;
  BoxReference box;
  anon_class_16_2_f7f469bf GetBoxAndOffset;
  int index_local;
  BoxArea fill_area_local;
  Element *this_local;
  
  if ((((int)fill_area < 1) || (3 < (int)fill_area)) &&
     (bVar3 = Assert("Render box can only be generated with fill area of border, padding or content."
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                     ,0x1f7), !bVar3)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  UpdateAbsoluteOffsetAndRenderBoxData(this);
  box.offset = (Vector2f)this;
  GetRenderBox::anon_class_16_2_f7f469bf::operator()
            ((BoxReference *)(edge_sizes._M_elems + 2),(anon_class_16_2_f7f469bf *)&box.offset);
  memset(&inner_size.y,0,0x10);
  for (inner_size.x = 1.4013e-45; (int)inner_size.x < (int)fill_area;
      inner_size.x = (float)((int)inner_size.x + 1)) {
    fVar5 = Box::GetEdge((Box *)edge_sizes._M_elems._8_8_,(BoxArea)inner_size.x,Top);
    pvVar4 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)&inner_size.y,0);
    *pvVar4 = fVar5 + *pvVar4;
    fVar5 = Box::GetEdge((Box *)edge_sizes._M_elems._8_8_,(BoxArea)inner_size.x,Right);
    pvVar4 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)&inner_size.y,1);
    *pvVar4 = fVar5 + *pvVar4;
    fVar5 = Box::GetEdge((Box *)edge_sizes._M_elems._8_8_,(BoxArea)inner_size.x,Bottom);
    pvVar4 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)&inner_size.y,2);
    *pvVar4 = fVar5 + *pvVar4;
    fVar5 = Box::GetEdge((Box *)edge_sizes._M_elems._8_8_,(BoxArea)inner_size.x,Left);
    pvVar4 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)&inner_size.y,3);
    *pvVar4 = fVar5 + *pvVar4;
  }
  Vector2<float>::Vector2(&local_5c);
  switch(fill_area) {
  case Margin:
  case Auto:
    bVar3 = Assert("RMLUI_ERROR",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                   ,0x219);
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    break;
  case Border:
    VVar2 = Box::GetFrameSize((Box *)edge_sizes._M_elems._8_8_,Border);
    local_5c = Vector2<float>::operator+((Vector2<float> *)&box,VVar2);
    break;
  case Padding:
    local_5c = (Vector2f)box.box;
    break;
  case Content:
    VVar2 = Box::GetFrameSize((Box *)edge_sizes._M_elems._8_8_,Padding);
    local_5c = Vector2<float>::operator-((Vector2<float> *)&box,VVar2);
  }
  VVar2 = local_5c;
  border_radius = Style::ComputedValues::border_radius(&this->meta->computed_values);
  border_widths._M_elems[2] = edge_sizes._M_elems[0];
  border_widths._M_elems[3] = edge_sizes._M_elems[1];
  border_widths._M_elems[0] = inner_size.y;
  border_widths._M_elems[1] = (float)area;
  RenderBox::RenderBox(__return_storage_ptr__,VVar2,box.padding_size,border_widths,border_radius);
  return __return_storage_ptr__;
}

Assistant:

RenderBox Element::GetRenderBox(BoxArea fill_area, int index)
{
	RMLUI_ASSERTMSG(fill_area >= BoxArea::Border && fill_area <= BoxArea::Content,
		"Render box can only be generated with fill area of border, padding or content.");

	UpdateAbsoluteOffsetAndRenderBoxData();

	struct BoxReference {
		const Box& box;
		Vector2f padding_size;
		Vector2f offset;
	};
	auto GetBoxAndOffset = [this, index]() {
		const int additional_box_index = index - 1;
		if (index < 1 || additional_box_index >= (int)additional_boxes.size())
			return BoxReference{main_box, rounded_main_padding_size, {}};
		const PositionedBox& positioned_box = additional_boxes[additional_box_index];
		return BoxReference{positioned_box.box, positioned_box.box.GetSize(BoxArea::Padding), positioned_box.offset.Round()};
	};

	BoxReference box = GetBoxAndOffset();

	EdgeSizes edge_sizes = {};
	for (int area = (int)BoxArea::Border; area < (int)fill_area; area++)
	{
		edge_sizes[0] += box.box.GetEdge(BoxArea(area), BoxEdge::Top);
		edge_sizes[1] += box.box.GetEdge(BoxArea(area), BoxEdge::Right);
		edge_sizes[2] += box.box.GetEdge(BoxArea(area), BoxEdge::Bottom);
		edge_sizes[3] += box.box.GetEdge(BoxArea(area), BoxEdge::Left);
	}
	Vector2f inner_size;
	switch (fill_area)
	{
	case BoxArea::Border: inner_size = box.padding_size + box.box.GetFrameSize(BoxArea::Border); break;
	case BoxArea::Padding: inner_size = box.padding_size; break;
	case BoxArea::Content: inner_size = box.padding_size - box.box.GetFrameSize(BoxArea::Padding); break;
	case BoxArea::Margin:
	case BoxArea::Auto: RMLUI_ERROR;
	}

	return RenderBox{inner_size, box.offset, edge_sizes, meta->computed_values.border_radius()};
}